

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

UniValue * JSON(string_view json)

{
  undefined1 *__nbytes;
  void *in_RDX;
  undefined8 in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *value;
  UniValue *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  const_string *msg;
  UniValue *file;
  unit_test_log_t *in_stack_ffffffffffffff38;
  const_string local_a8 [2];
  lazy_ostream local_88 [2];
  undefined8 local_68;
  void *pvStack_60;
  assertion_result local_50;
  undefined1 local_38 [32];
  undefined8 local_18;
  void *pvStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  local_18 = in_RSI;
  pvStack_10 = in_RDX;
  UniValue::UniValue(in_stack_fffffffffffffef8);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (pointer)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (unsigned_long)in_stack_fffffffffffffef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffef8);
    __nbytes = local_38;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff38,(const_string *)file,(size_t)in_RDI,msg);
    local_68 = local_18;
    pvStack_60 = pvStack_10;
    UniValue::read(in_RDI,(int)local_18,pvStack_10,(size_t)__nbytes);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (bool)in_stack_ffffffffffffff07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (pointer)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (unsigned_long)in_stack_fffffffffffffef8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (basic_cstring<const_char> *)in_stack_fffffffffffffef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               (pointer)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (unsigned_long)in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef8 = (UniValue *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,local_88,local_a8,0x19,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffef8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff0f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffff0f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return file;
}

Assistant:

static UniValue JSON(std::string_view json)
{
    UniValue value;
    BOOST_CHECK(value.read(json));
    return value;
}